

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::add_composite_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  ID id;
  uint uVar1;
  SPIRVariable *pSVar2;
  InterfaceBlockMeta *pIVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  SPIRType *pSVar14;
  CompilerError *pCVar15;
  undefined8 extraout_RAX;
  Bitset *pBVar16;
  SPIREntryPoint *pSVar17;
  undefined8 extraout_RAX_00;
  size_type sVar18;
  mapped_type *pmVar19;
  size_type sVar20;
  _func_void *p_Var21;
  CompilerMSL *this_00;
  SPIRType *ts_2;
  uint local_1e4;
  uint32_t local_1e0;
  char local_1da;
  char local_1d9;
  size_t local_1d8;
  undefined4 local_1cc;
  undefined4 local_1c8;
  uint32_t local_1c4;
  SPIRType *local_1c0;
  SPIRVariable *local_1b8;
  undefined4 local_1ac;
  uint32_t local_1a8;
  uint local_1a4;
  SPIRFunction *local_1a0;
  InterfaceBlockMeta *local_198;
  undefined1 local_190 [32];
  string local_170 [24];
  ulong *local_158;
  undefined1 *local_150;
  ulong local_148;
  undefined1 uStack_140;
  undefined7 uStack_13f;
  long lStack_138;
  undefined5 local_130;
  undefined3 uStack_12b;
  uint local_128;
  undefined1 local_124;
  undefined1 *local_120;
  long local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  long lStack_108;
  string *local_100;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_f8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_c8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_c0;
  SmallVector<std::function<void_()>,_0UL> *local_b8;
  string flatten_from_ib_mbr_name;
  string mbr_name;
  string local_70;
  string local_50;
  
  local_100 = ib_var_ref;
  local_1a0 = Compiler::get<spirv_cross::SPIRFunction>
                        ((Compiler *)this,
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  local_198 = meta;
  if (meta->strip_array == true) {
    pSVar14 = Compiler::get_variable_element_type((Compiler *)this,var);
  }
  else {
    pSVar14 = Compiler::get_variable_data_type((Compiler *)this,var);
  }
  ts_2 = pSVar14;
  bVar6 = add_component_variable_to_interface_block(this,storage,local_100,var,pSVar14,local_198);
  if (bVar6) {
    return;
  }
  bVar6 = Compiler::is_matrix((Compiler *)this,pSVar14);
  bVar7 = Compiler::is_array((Compiler *)this,pSVar14);
  if (bVar6) {
    if (bVar7) {
      pCVar15 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)local_190,
                 "MSL cannot emit arrays-of-matrices in input and output variables.",
                 (allocator *)&flatten_from_ib_mbr_name);
      CompilerError::CompilerError(pCVar15,(string *)local_190);
      __cxa_throw(pCVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_1a8 = pSVar14->columns;
  }
  else {
    local_1a8 = 0;
    if (bVar7) {
      if ((pSVar14->array).super_VectorView<unsigned_int>.buffer_size != 1) {
        pCVar15 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_190,
                   "MSL cannot emit arrays-of-arrays in input and output variables.",
                   (allocator *)&flatten_from_ib_mbr_name);
        CompilerError::CompilerError(pCVar15,(string *)local_190);
        __cxa_throw(pCVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_1a8 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar14);
    }
  }
  bVar6 = Compiler::is_builtin_variable((Compiler *)this,var);
  local_1e0 = Compiler::get_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
  local_1d9 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationFlat);
  bVar7 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationNoPerspective);
  bVar8 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationCentroid);
  bVar9 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationSample);
  if (pSVar14->pointer != true) goto LAB_00302d59;
  do {
    pSVar14 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar14->parent_type).id);
LAB_00302d59:
    bVar10 = Compiler::is_array((Compiler *)this,pSVar14);
  } while ((bVar10) || (bVar10 = Compiler::is_matrix((Compiler *)this,pSVar14), bVar10));
  if (bVar6) {
    id.id = (var->super_IVariant).self.id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
              ((string *)local_190,this,(ulong)local_1e0,7);
    Compiler::set_name((Compiler *)this,id,(string *)local_190);
    ::std::__cxx11::string::~string((string *)local_190);
  }
  flatten_from_ib_mbr_name._M_dataplus._M_p = (pointer)&flatten_from_ib_mbr_name.field_2;
  flatten_from_ib_mbr_name._M_string_length = 0;
  flatten_from_ib_mbr_name.field_2._M_local_buf[0] = '\0';
  local_1c0 = pSVar14;
  if ((bVar6 && storage == StorageClassOutput) && local_1e0 == 3) {
    uVar12 = (uint32_t)
             (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
             buffer_size;
    uVar11 = Compiler::get_variable_data_type_id((Compiler *)this,var);
    local_190._0_4_ = uVar11;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              (&ib_type->member_types,(TypedID<(spirv_cross::Types)1> *)local_190);
    ts_2 = (SPIRType *)0x3;
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar12,DecorationBuiltIn,3
              );
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(local_190,this,3);
    ::std::__cxx11::string::operator=((string *)&flatten_from_ib_mbr_name,(string *)local_190);
    ::std::__cxx11::string::~string((string *)local_190);
    Compiler::set_member_name
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar12,
               &flatten_from_ib_mbr_name);
    local_1ac = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    pSVar14 = local_1c0;
    if ((this->msl_options).enable_clip_distance_user_varying == false) goto LAB_00302e8f;
  }
  else {
    if (local_198->strip_array == false) {
      SPIRFunction::add_local_variable(local_1a0,(VariableID)(var->super_IVariant).self.id);
      local_190._0_4_ = (var->super_IVariant).self.id;
      SmallVector<unsigned_int,_8UL>::push_back
                (&this->vars_needing_early_declaration,(uint *)local_190);
    }
    local_1ac = 0;
  }
  local_f0 = &ib_type->member_types;
  local_f8 = &(this->pull_model_inputs)._M_h;
  local_c8 = &(this->outputs_by_builtin)._M_h;
  local_c0 = &(this->inputs_by_builtin)._M_h;
  local_1da = local_1e0 - 3 < 2 && bVar6;
  local_b8 = &local_1a0->fixup_hooks_out;
  local_1a0 = (SPIRFunction *)&local_1a0->fixup_hooks_in;
  local_1b8 = var;
  for (local_1e4 = 0; local_1e4 < local_1a8; local_1e4 = local_1e4 + 1) {
    local_1d8 = (ib_type->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
    local_1c4 = (pSVar14->super_IVariant).self.id;
    pBVar16 = Compiler::get_decoration_bitset((Compiler *)this,(ID)(var->super_IVariant).self.id);
    local_1a4 = (uint)bVar7;
    if (((pBVar16->lower & 0x40000000) == 0) ||
       ((this->msl_options).pad_fragment_output_components != true)) {
LAB_0030300a:
      if (storage != StorageClassInput) {
        local_1c8 = 0;
        goto LAB_0030307b;
      }
      local_190._0_4_ = (var->super_IVariant).self.id;
      sVar20 = ::std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(local_f8,(key_type *)local_190);
      if (sVar20 == 0) {
        local_1c8 = 0;
        local_1cc = 1;
        goto LAB_00303093;
      }
      uVar12 = Compiler::get_pointee_type_id((Compiler *)this,local_1c4);
      uVar12 = build_msl_interpolant_type(this,uVar12,SUB41(local_1a4,0));
      local_190._0_4_ = uVar12;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                (local_f0,(TypedID<(spirv_cross::Types)1> *)local_190);
      local_1cc = (undefined4)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
      local_1c8 = 0;
    }
    else {
      pSVar17 = Compiler::get_entry_point((Compiler *)this);
      if ((storage != StorageClassOutput) || (pSVar17->model != ExecutionModelFragment))
      goto LAB_0030300a;
      uVar12 = Compiler::get_decoration
                         ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
      uVar11 = get_target_components_for_fragment_location(this,uVar12 + local_1e4);
      uVar1 = pSVar14->vecsize;
      uVar12 = uVar11;
      if (uVar1 < uVar11) {
        uVar12 = build_extended_vector_type(this,(pSVar14->super_IVariant).self.id,uVar11,Unknown);
        local_1c4 = uVar12;
      }
      local_1c8 = CONCAT31((int3)(uVar12 >> 8),uVar1 < uVar11);
      var = local_1b8;
LAB_0030307b:
      local_1cc = 0;
LAB_00303093:
      uVar12 = Compiler::get_pointee_type_id((Compiler *)this,local_1c4);
      local_190._0_4_ = uVar12;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                (local_f0,(TypedID<(spirv_cross::Types)1> *)local_190);
    }
    CompilerGLSL::to_expression_abi_cxx11_
              ((string *)local_190,&this->super_CompilerGLSL,(var->super_IVariant).self.id,true);
    join<std::__cxx11::string,char_const(&)[2],unsigned_int&>
              (&local_70,(spirv_cross *)local_190,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a29dc,
               (char (*) [2])&local_1e4,(uint *)ts_2);
    this_00 = (CompilerMSL *)0x3b2f7f;
    ::std::__cxx11::string::string((string *)&local_50,"m",(allocator *)local_e8._M_pod_data);
    ensure_valid_name(&mbr_name,this_00,&local_70,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)local_190);
    Compiler::set_member_name
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1d8,
               &mbr_name);
    pBVar16 = Compiler::get_decoration_bitset
                        ((Compiler *)this,(ID)(local_1b8->super_IVariant).self.id);
    pSVar2 = local_1b8;
    if ((pBVar16->lower & 0x40000000) == 0) {
      if (bVar6) {
        bVar10 = Compiler::is_tessellation_shader((Compiler *)this);
        if ((bVar10 & (byte)local_1cc) == 1) {
          local_190._0_4_ = local_1e0;
          sVar18 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count(local_c0,(key_type *)local_190);
          if (sVar18 != 0) {
            local_190._0_4_ = local_1e0;
            pmVar19 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_c0,(key_type *)local_190);
            uVar12 = local_1e4 + pmVar19->location;
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,
                       (uint32_t)local_1d8,DecorationLocation,uVar12);
            mark_location_as_used_by_shader(this,uVar12,local_1c0,StorageClassInput,false);
            goto LAB_003033d5;
          }
        }
        else if ((storage == StorageClassOutput) && ((this->capture_output_to_buffer & 1U) != 0)) {
          local_190._0_4_ = local_1e0;
          sVar18 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count(local_c8,(key_type *)local_190);
          if (sVar18 != 0) {
            local_190._0_4_ = local_1e0;
            pmVar19 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_c8,(key_type *)local_190);
            uVar12 = local_1e4 + pmVar19->location;
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,
                       (uint32_t)local_1d8,DecorationLocation,uVar12);
            mark_location_as_used_by_shader(this,uVar12,local_1c0,StorageClassOutput,false);
            goto LAB_003033d5;
          }
        }
      }
      if (local_1da != '\0') {
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1d8,
                   DecorationBuiltIn,local_1e0);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1d8,
                   DecorationIndex,local_1e4);
      }
    }
    else {
      uVar12 = Compiler::get_decoration
                         ((Compiler *)this,(ID)(local_1b8->super_IVariant).self.id,
                          DecorationLocation);
      uVar12 = uVar12 + local_1e4;
      uVar11 = Compiler::get_decoration
                         ((Compiler *)this,(ID)(pSVar2->super_IVariant).self.id,DecorationComponent)
      ;
      pIVar3 = local_198;
      pSVar2 = local_1b8;
      if ((byte)local_1cc != '\0') {
        uVar13 = ensure_correct_input_type
                           (this,*(uint32_t *)&(local_1b8->super_IVariant).field_0xc,uVar12,uVar11,0
                            ,local_198->strip_array);
        *(uint32_t *)&(pSVar2->super_IVariant).field_0xc = uVar13;
        uVar13 = ensure_correct_input_type
                           (this,(local_1c0->super_IVariant).self.id,uVar12,uVar11,0,
                            pIVar3->strip_array);
        local_190._0_4_ = (pSVar2->super_IVariant).self.id;
        sVar20 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(local_f8,(key_type *)local_190);
        if (sVar20 != 0) {
          uVar13 = build_msl_interpolant_type(this,uVar13,SUB41(local_1a4,0));
        }
        (local_f0->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr
        [local_1d8 & 0xffffffff].id = uVar13;
      }
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1d8,
                 DecorationLocation,uVar12);
      if (uVar11 != 0) {
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1d8,
                   DecorationComponent,uVar11);
      }
      mark_location_as_used_by_shader(this,uVar12,local_1c0,storage,false);
    }
LAB_003033d5:
    pBVar16 = Compiler::get_decoration_bitset
                        ((Compiler *)this,(ID)(local_1b8->super_IVariant).self.id);
    pSVar2 = local_1b8;
    if ((pBVar16->lower & 0x100000000) != 0) {
      uVar12 = Compiler::get_decoration
                         ((Compiler *)this,(ID)(local_1b8->super_IVariant).self.id,DecorationIndex);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1d8,
                 DecorationIndex,uVar12);
    }
    if ((byte)local_1cc == '\0') {
LAB_0030343d:
      if (local_1d9 != '\0') {
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1d8,
                   DecorationFlat,0);
      }
      if (bVar7) {
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1d8,
                   DecorationNoPerspective,0);
      }
      if (bVar8) {
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1d8,
                   DecorationCentroid,0);
      }
      if (bVar9) {
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_1d8,
                   DecorationSample,0);
      }
    }
    else {
      local_190._0_4_ = (pSVar2->super_IVariant).self.id;
      sVar20 = ::std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(local_f8,(key_type *)local_190);
      if (sVar20 == 0) goto LAB_0030343d;
    }
    uVar1 = (local_1b8->super_IVariant).self.id;
    ts_2 = (SPIRType *)(ulong)uVar1;
    Compiler::set_extended_member_decoration
              ((Compiler *)this,(ib_type->super_IVariant).self.id,(uint32_t)local_1d8,
               SPIRVCrossDecorationInterfaceOrigID,uVar1);
    uVar4 = local_190._8_8_;
    var = local_1b8;
    pSVar14 = local_1c0;
    uVar5 = local_190._12_4_;
    local_190._8_8_ = uVar4;
    if (local_198->strip_array == false) {
      local_190._12_4_ = (undefined4)((ulong)this >> 0x20);
      if (storage == StorageClassOutput) {
        local_190._0_8_ = local_1b8;
        local_190._9_3_ = SUB83(uVar4,1);
        local_190[8] = (char)local_1c8;
        local_190[0x10] = SUB81(this,0);
        local_190[0x11] = (undefined1)((ulong)this >> 8);
        local_190._18_2_ = (undefined2)((ulong)this >> 0x10);
        local_190._24_4_ = local_1c4;
        local_190._20_4_ = local_190._12_4_;
        local_190._12_4_ = uVar5;
        ::std::__cxx11::string::string(local_170,(string *)local_100);
        ::std::__cxx11::string::string((string *)&local_150,(string *)&mbr_name);
        local_130 = SUB85(pSVar14,0);
        uStack_12b = (undefined3)((ulong)pSVar14 >> 0x28);
        local_128 = local_1e4;
        local_124 = (undefined1)local_1ac;
        ::std::__cxx11::string::string((string *)&local_120,(string *)&flatten_from_ib_mbr_name);
        local_d8 = (code *)0x0;
        pcStack_d0 = (code *)0x0;
        local_e8._M_unused._M_object = (void *)0x0;
        local_e8._8_8_ = 0;
        p_Var21 = (_func_void *)operator_new(0x90);
        *(ulong *)(p_Var21 + 0xc) =
             CONCAT26(local_190._18_2_,
                      CONCAT15(local_190[0x11],CONCAT14(local_190[0x10],local_190._12_4_)));
        *(ulong *)(p_Var21 + 0x14) = CONCAT44(local_190._24_4_,local_190._20_4_);
        *(undefined8 *)p_Var21 = local_190._0_8_;
        *(long *)(p_Var21 + 8) = CONCAT44(local_190._12_4_,local_190._8_4_);
        ::std::__cxx11::string::string((string *)(p_Var21 + 0x20),local_170);
        *(_func_void **)(p_Var21 + 0x40) = p_Var21 + 0x50;
        if (local_150 == &uStack_140) {
          *(long *)(p_Var21 + 0x50) = CONCAT71(uStack_13f,uStack_140);
          *(long *)(p_Var21 + 0x58) = lStack_138;
        }
        else {
          *(undefined1 **)(p_Var21 + 0x40) = local_150;
          *(long *)(p_Var21 + 0x50) = CONCAT71(uStack_13f,uStack_140);
        }
        *(ulong *)(p_Var21 + 0x48) = local_148;
        local_148 = 0;
        uStack_140 = 0;
        *(ulong *)(p_Var21 + 0x65) = CONCAT17(local_124,CONCAT43(local_128,uStack_12b));
        *(long *)(p_Var21 + 0x60) = CONCAT35(uStack_12b,local_130);
        *(_func_void **)(p_Var21 + 0x70) = p_Var21 + 0x80;
        if (local_120 == &local_110) {
          *(long *)(p_Var21 + 0x80) = CONCAT71(uStack_10f,local_110);
          *(long *)(p_Var21 + 0x88) = lStack_108;
        }
        else {
          *(undefined1 **)(p_Var21 + 0x70) = local_120;
          *(long *)(p_Var21 + 0x80) = CONCAT71(uStack_10f,local_110);
        }
        *(long *)(p_Var21 + 0x78) = local_118;
        local_118 = 0;
        local_110 = 0;
        pcStack_d0 = ::std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:2804:42)>
                     ::_M_invoke;
        local_d8 = ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:2804:42)>
                   ::_M_manager;
        local_150 = &uStack_140;
        local_120 = &local_110;
        local_e8._M_unused._0_8_ = (undefined8)p_Var21;
        SmallVector<std::function<void_()>,_0UL>::push_back(local_b8,(function<void_()> *)&local_e8)
        ;
        ::std::_Function_base::~_Function_base((_Function_base *)&local_e8);
        add_composite_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)
        ::$_1::~__1((__1 *)local_190);
      }
      else if (storage == StorageClassInput) {
        local_190._0_8_ = local_1b8;
        local_190._20_4_ = local_1e4;
        local_190[0x10] = bVar8;
        local_190[0x11] = bVar9;
        local_190._8_8_ = this;
        ::std::__cxx11::string::string((string *)(local_190 + 0x18),(string *)local_100);
        ::std::__cxx11::string::string((string *)&local_158,(string *)&mbr_name);
        local_d8 = (code *)0x0;
        pcStack_d0 = (code *)0x0;
        local_e8._M_unused._M_object = (void *)0x0;
        local_e8._8_8_ = 0;
        p_Var21 = (_func_void *)operator_new(0x58);
        *(long *)(p_Var21 + 0x10) =
             CONCAT44(local_190._20_4_,
                      CONCAT22(local_190._18_2_,CONCAT11(local_190[0x11],local_190[0x10])));
        *(undefined8 *)p_Var21 = local_190._0_8_;
        *(undefined8 *)(p_Var21 + 8) = local_190._8_8_;
        ::std::__cxx11::string::string((string *)(p_Var21 + 0x18),(string *)(local_190 + 0x18));
        *(_func_void **)(p_Var21 + 0x38) = p_Var21 + 0x48;
        if (local_158 == &local_148) {
          *(ulong *)(p_Var21 + 0x48) = local_148;
          *(long *)(p_Var21 + 0x50) = CONCAT71(uStack_13f,uStack_140);
        }
        else {
          *(ulong **)(p_Var21 + 0x38) = local_158;
          *(ulong *)(p_Var21 + 0x48) = local_148;
        }
        *(undefined1 **)(p_Var21 + 0x40) = local_150;
        local_150 = (undefined1 *)0x0;
        local_148 = local_148 & 0xffffffffffffff00;
        pcStack_d0 = ::std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:2784:41)>
                     ::_M_invoke;
        local_d8 = ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:2784:41)>
                   ::_M_manager;
        local_158 = &local_148;
        local_e8._M_unused._0_8_ = (undefined8)p_Var21;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  ((SmallVector<std::function<void_()>,_0UL> *)local_1a0,
                   (function<void_()> *)&local_e8);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_e8);
        add_composite_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)
        ::$_0::~__0((__0 *)local_190);
      }
    }
    pSVar14 = local_1c0;
    ::std::__cxx11::string::~string((string *)&mbr_name);
  }
LAB_00302e8f:
  ::std::__cxx11::string::~string((string *)&flatten_from_ib_mbr_name);
  return;
}

Assistant:

void CompilerMSL::add_composite_variable_to_interface_block(StorageClass storage, const string &ib_var_ref,
                                                            SPIRType &ib_type, SPIRVariable &var,
                                                            InterfaceBlockMeta &meta)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	auto &var_type = meta.strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	uint32_t elem_cnt = 0;

	if (add_component_variable_to_interface_block(storage, ib_var_ref, var, var_type, meta))
		return;

	if (is_matrix(var_type))
	{
		if (is_array(var_type))
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

		elem_cnt = var_type.columns;
	}
	else if (is_array(var_type))
	{
		if (var_type.array.size() != 1)
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

		elem_cnt = to_array_size_literal(var_type);
	}

	bool is_builtin = is_builtin_variable(var);
	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_flat = has_decoration(var.self, DecorationFlat);
	bool is_noperspective = has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = has_decoration(var.self, DecorationCentroid);
	bool is_sample = has_decoration(var.self, DecorationSample);

	auto *usable_type = &var_type;
	if (usable_type->pointer)
		usable_type = &get<SPIRType>(usable_type->parent_type);
	while (is_array(*usable_type) || is_matrix(*usable_type))
		usable_type = &get<SPIRType>(usable_type->parent_type);

	// If a builtin, force it to have the proper name.
	if (is_builtin)
		set_name(var.self, builtin_to_glsl(builtin, StorageClassFunction));

	bool flatten_from_ib_var = false;
	string flatten_from_ib_mbr_name;

	if (storage == StorageClassOutput && is_builtin && builtin == BuiltInClipDistance)
	{
		// Also declare [[clip_distance]] attribute here.
		uint32_t clip_array_mbr_idx = uint32_t(ib_type.member_types.size());
		ib_type.member_types.push_back(get_variable_data_type_id(var));
		set_member_decoration(ib_type.self, clip_array_mbr_idx, DecorationBuiltIn, BuiltInClipDistance);

		flatten_from_ib_mbr_name = builtin_to_glsl(BuiltInClipDistance, StorageClassOutput);
		set_member_name(ib_type.self, clip_array_mbr_idx, flatten_from_ib_mbr_name);

		// When we flatten, we flatten directly from the "out" struct,
		// not from a function variable.
		flatten_from_ib_var = true;

		if (!msl_options.enable_clip_distance_user_varying)
			return;
	}
	else if (!meta.strip_array)
	{
		// Only flatten/unflatten IO composites for non-tessellation cases where arrays are not stripped.
		entry_func.add_local_variable(var.self);
		// We need to declare the variable early and at entry-point scope.
		vars_needing_early_declaration.push_back(var.self);
	}

	for (uint32_t i = 0; i < elem_cnt; i++)
	{
		// Add a reference to the variable type to the interface struct.
		uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());

		uint32_t target_components = 0;
		bool padded_output = false;
		uint32_t type_id = usable_type->self;

		// Check if we need to pad fragment output to match a certain number of components.
		if (get_decoration_bitset(var.self).get(DecorationLocation) && msl_options.pad_fragment_output_components &&
		    get_entry_point().model == ExecutionModelFragment && storage == StorageClassOutput)
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation) + i;
			target_components = get_target_components_for_fragment_location(locn);
			if (usable_type->vecsize < target_components)
			{
				// Make a new type here.
				type_id = build_extended_vector_type(usable_type->self, target_components);
				padded_output = true;
			}
		}

		if (storage == StorageClassInput && pull_model_inputs.count(var.self))
			ib_type.member_types.push_back(build_msl_interpolant_type(get_pointee_type_id(type_id), is_noperspective));
		else
			ib_type.member_types.push_back(get_pointee_type_id(type_id));

		// Give the member a name
		string mbr_name = ensure_valid_name(join(to_expression(var.self), "_", i), "m");
		set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

		// There is no qualified alias since we need to flatten the internal array on return.
		if (get_decoration_bitset(var.self).get(DecorationLocation))
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation) + i;
			uint32_t comp = get_decoration(var.self, DecorationComponent);
			if (storage == StorageClassInput)
			{
				var.basetype = ensure_correct_input_type(var.basetype, locn, comp, 0, meta.strip_array);
				uint32_t mbr_type_id = ensure_correct_input_type(usable_type->self, locn, comp, 0, meta.strip_array);
				if (storage == StorageClassInput && pull_model_inputs.count(var.self))
					ib_type.member_types[ib_mbr_idx] = build_msl_interpolant_type(mbr_type_id, is_noperspective);
				else
					ib_type.member_types[ib_mbr_idx] = mbr_type_id;
			}
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			if (comp)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationComponent, comp);
			mark_location_as_used_by_shader(locn, *usable_type, storage);
		}
		else if (is_builtin && is_tessellation_shader() && storage == StorageClassInput && inputs_by_builtin.count(builtin))
		{
			uint32_t locn = inputs_by_builtin[builtin].location + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, *usable_type, storage);
		}
		else if (is_builtin && capture_output_to_buffer && storage == StorageClassOutput && outputs_by_builtin.count(builtin))
		{
			uint32_t locn = outputs_by_builtin[builtin].location + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, *usable_type, storage);
		}
		else if (is_builtin && (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance))
		{
			// Declare the Clip/CullDistance as [[user(clip/cullN)]].
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationIndex, i);
		}

		if (get_decoration_bitset(var.self).get(DecorationIndex))
		{
			uint32_t index = get_decoration(var.self, DecorationIndex);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationIndex, index);
		}

		if (storage != StorageClassInput || !pull_model_inputs.count(var.self))
		{
			// Copy interpolation decorations if needed
			if (is_flat)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
			if (is_noperspective)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
			if (is_centroid)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
			if (is_sample)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);
		}

		set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);

		// Only flatten/unflatten IO composites for non-tessellation cases where arrays are not stripped.
		if (!meta.strip_array)
		{
			switch (storage)
			{
			case StorageClassInput:
				entry_func.fixup_hooks_in.push_back([=, &var]() {
					if (pull_model_inputs.count(var.self))
					{
						string lerp_call;
						if (is_centroid)
							lerp_call = ".interpolate_at_centroid()";
						else if (is_sample)
							lerp_call = join(".interpolate_at_sample(", to_expression(builtin_sample_id_id), ")");
						else
							lerp_call = ".interpolate_at_center()";
						statement(to_name(var.self), "[", i, "] = ", ib_var_ref, ".", mbr_name, lerp_call, ";");
					}
					else
					{
						statement(to_name(var.self), "[", i, "] = ", ib_var_ref, ".", mbr_name, ";");
					}
				});
				break;

			case StorageClassOutput:
				entry_func.fixup_hooks_out.push_back([=, &var]() {
					if (padded_output)
					{
						auto &padded_type = this->get<SPIRType>(type_id);
						statement(
						    ib_var_ref, ".", mbr_name, " = ",
						    remap_swizzle(padded_type, usable_type->vecsize, join(to_name(var.self), "[", i, "]")),
						    ";");
					}
					else if (flatten_from_ib_var)
						statement(ib_var_ref, ".", mbr_name, " = ", ib_var_ref, ".", flatten_from_ib_mbr_name, "[", i,
						          "];");
					else
						statement(ib_var_ref, ".", mbr_name, " = ", to_name(var.self), "[", i, "];");
				});
				break;

			default:
				break;
			}
		}
	}
}